

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,Bitset *flags)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((flags->lower & 0x4000) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((flags->lower & 0x2000) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((flags->lower & 0x10000) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((flags->lower & 0x8000) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((flags->lower & 0x20000) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((flags->lower & 0x40000) != 0) &&
     ((this->super_CompilerGLSL).backend.support_precise_qualifier == true)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "linear ";
	if (flags.get(DecorationFlat))
		res += "nointerpolation ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch "; // Seems to be different in actual HLSL.
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant) && backend.support_precise_qualifier)
		res += "precise "; // Not supported?

	return res;
}